

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O1

size_t __thiscall Diligent::StandardFile::GetPos(StandardFile *this)

{
  size_t sVar1;
  string msg;
  string local_30;
  
  if (this->m_pFile == (FILE *)0x0) {
    FormatString<char[19]>(&local_30,(char (*) [19])"File is not opened");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetPos",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if ((FILE *)this->m_pFile == (FILE *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = ftell((FILE *)this->m_pFile);
  }
  return sVar1;
}

Assistant:

size_t StandardFile::GetPos()
{
    VERIFY(m_pFile, "File is not opened");
    if (!m_pFile)
        return 0;

    return ftell(m_pFile);
}